

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chipset.c
# Opt level: O0

int is_igp(int chipset)

{
  int local_c;
  int chipset_local;
  
  if ((((((chipset == 10) || (chipset == 0x1a)) || (chipset == 0x1f)) ||
       ((chipset == 0x2a || (chipset == 0x4c)))) ||
      ((chipset == 0x4e || ((chipset == 99 || (chipset - 0x67U < 2)))))) ||
     ((chipset == 0xaa || ((chipset == 0xac || (chipset == 0xaf)))))) {
    local_c = 1;
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

int is_igp(int chipset) {
	switch (chipset) {
		case 0x0a:
		case 0x1a:
		case 0x1f:
		case 0x2a:
		case 0x4e:
		case 0x4c:
		case 0x67:
		case 0x68:
		case 0x63:
		case 0xaa:
		case 0xac:
		case 0xaf:
			return 1;
		default:
			return 0;
	}
}